

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void __thiscall
csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>::Vertex
          (Vertex<sliding_puzzle::SlidingPuzzleState,_double> *this,StatePtr *state)

{
  double dVar1;
  shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> local_28;
  StatePtr *local_18;
  StatePtr *state_local;
  Vertex<sliding_puzzle::SlidingPuzzleState,_double> *this_local;
  
  local_18 = state;
  state_local = (StatePtr *)this;
  csbpl_common::Heap<double>::Element::Element(&this->super_Element,0.0,-1);
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::shared_ptr(&this->state_,state);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::shared_ptr
            (&this->parent_vertex_);
  std::
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  ::vector(&this->mha_copy_);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::shared_ptr
            (&this->self_ptr_);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::shared_ptr
            (&this->np_copy_);
  dVar1 = std::numeric_limits<double>::infinity();
  (this->super_Element).key_ = dVar1;
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::shared_ptr
            (&local_28,(nullptr_t)0x0);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
            (&this->parent_vertex_,&local_28);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::~shared_ptr
            (&local_28);
  dVar1 = std::numeric_limits<double>::infinity();
  this->g_cost_ = dVar1;
  dVar1 = std::numeric_limits<double>::infinity();
  this->f_cost_ = dVar1;
  return;
}

Assistant:

Vertex(StatePtr state) : state_(state)
  {
    this->key_ = std::numeric_limits<double>::infinity();
    parent_vertex_ = nullptr;
    g_cost_ = std::numeric_limits<double>::infinity();
    f_cost_ = std::numeric_limits<double>::infinity();
  }